

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkcs8_x509.cc
# Opt level: O0

int PKCS12_handle_content_info(CBS *content_info,pkcs12_context *ctx)

{
  char *pass;
  int iVar1;
  size_t sVar2;
  uint8_t *in;
  size_t in_len;
  undefined1 local_d8 [8];
  CBS octet_string_contents;
  CBS safe_contents;
  size_t out_len;
  uint8_t *out;
  CBS encrypted_contents;
  CBS ai;
  CBS contents_type;
  CBS eci;
  CBS version_bytes;
  uint8_t *storage;
  undefined1 local_48 [4];
  int ret;
  CBS contents;
  CBS wrapped_contents;
  CBS content_type;
  pkcs12_context *ctx_local;
  CBS *content_info_local;
  
  storage._4_4_ = 0;
  version_bytes.len = 0;
  iVar1 = CBS_get_asn1(content_info,(CBS *)&wrapped_contents.len,6);
  if (((iVar1 == 0) ||
      (iVar1 = CBS_get_asn1(content_info,(CBS *)&contents.len,0xa0000000), iVar1 == 0)) ||
     (sVar2 = CBS_len(content_info), sVar2 != 0)) {
    ERR_put_error(0x13,0,100,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs8/pkcs8_x509.cc"
                  ,0x1bc);
  }
  else {
    iVar1 = CBS_mem_equal((CBS *)&wrapped_contents.len,kPKCS7EncryptedData,9);
    if (iVar1 == 0) {
      iVar1 = CBS_mem_equal((CBS *)&wrapped_contents.len,kPKCS7Data,9);
      if (iVar1 == 0) {
        storage._4_4_ = 1;
      }
      else {
        iVar1 = CBS_get_asn1((CBS *)&contents.len,(CBS *)local_d8,4);
        if (iVar1 == 0) {
          ERR_put_error(0x13,0,100,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs8/pkcs8_x509.cc"
                        ,0x1ef);
        }
        else {
          storage._4_4_ = PKCS12_handle_sequence((CBS *)local_d8,ctx,PKCS12_handle_safe_bag);
        }
      }
    }
    else {
      iVar1 = CBS_get_asn1((CBS *)&contents.len,(CBS *)local_48,0x20000010);
      if ((((iVar1 == 0) || (iVar1 = CBS_get_asn1((CBS *)local_48,(CBS *)&eci.len,2), iVar1 == 0))
          || ((iVar1 = CBS_get_asn1((CBS *)local_48,(CBS *)&contents_type.len,0x20000010),
              iVar1 == 0 ||
              ((iVar1 = CBS_get_asn1((CBS *)&contents_type.len,(CBS *)&ai.len,6), iVar1 == 0 ||
               (iVar1 = CBS_get_asn1((CBS *)&contents_type.len,(CBS *)&encrypted_contents.len,
                                     0x20000010), iVar1 == 0)))))) ||
         (iVar1 = CBS_get_asn1_implicit_string
                            ((CBS *)&contents_type.len,(CBS *)&out,(uint8_t **)&version_bytes.len,
                             0x80000000,4), iVar1 == 0)) {
        ERR_put_error(0x13,0,100,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs8/pkcs8_x509.cc"
                      ,0x1d7);
      }
      else {
        iVar1 = CBS_mem_equal((CBS *)&ai.len,kPKCS7Data,9);
        if (iVar1 == 0) {
          ERR_put_error(0x13,0,100,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs8/pkcs8_x509.cc"
                        ,0x1dc);
        }
        else {
          pass = ctx->password;
          sVar2 = ctx->password_len;
          in = CBS_data((CBS *)&out);
          in_len = CBS_len((CBS *)&out);
          iVar1 = pkcs8_pbe_decrypt((uint8_t **)&out_len,&safe_contents.len,
                                    (CBS *)&encrypted_contents.len,pass,sVar2,in,in_len);
          if (iVar1 != 0) {
            CBS_init((CBS *)&octet_string_contents.len,(uint8_t *)out_len,safe_contents.len);
            storage._4_4_ =
                 PKCS12_handle_sequence
                           ((CBS *)&octet_string_contents.len,ctx,PKCS12_handle_safe_bag);
            OPENSSL_free((void *)out_len);
          }
        }
      }
    }
  }
  OPENSSL_free((void *)version_bytes.len);
  return storage._4_4_;
}

Assistant:

static int PKCS12_handle_content_info(CBS *content_info,
                                      struct pkcs12_context *ctx) {
  CBS content_type, wrapped_contents, contents;
  int ret = 0;
  uint8_t *storage = NULL;

  if (!CBS_get_asn1(content_info, &content_type, CBS_ASN1_OBJECT) ||
      !CBS_get_asn1(content_info, &wrapped_contents,
                    CBS_ASN1_CONTEXT_SPECIFIC | CBS_ASN1_CONSTRUCTED | 0) ||
      CBS_len(content_info) != 0) {
    OPENSSL_PUT_ERROR(PKCS8, PKCS8_R_BAD_PKCS12_DATA);
    goto err;
  }

  if (CBS_mem_equal(&content_type, kPKCS7EncryptedData,
                    sizeof(kPKCS7EncryptedData))) {
    // See https://tools.ietf.org/html/rfc2315#section-13.
    //
    // PKCS#7 encrypted data inside a PKCS#12 structure is generally an
    // encrypted certificate bag and it's generally encrypted with 40-bit
    // RC2-CBC.
    CBS version_bytes, eci, contents_type, ai, encrypted_contents;
    uint8_t *out;
    size_t out_len;

    if (!CBS_get_asn1(&wrapped_contents, &contents, CBS_ASN1_SEQUENCE) ||
        !CBS_get_asn1(&contents, &version_bytes, CBS_ASN1_INTEGER) ||
        // EncryptedContentInfo, see
        // https://tools.ietf.org/html/rfc2315#section-10.1
        !CBS_get_asn1(&contents, &eci, CBS_ASN1_SEQUENCE) ||
        !CBS_get_asn1(&eci, &contents_type, CBS_ASN1_OBJECT) ||
        // AlgorithmIdentifier, see
        // https://tools.ietf.org/html/rfc5280#section-4.1.1.2
        !CBS_get_asn1(&eci, &ai, CBS_ASN1_SEQUENCE) ||
        !CBS_get_asn1_implicit_string(&eci, &encrypted_contents, &storage,
                                      CBS_ASN1_CONTEXT_SPECIFIC | 0,
                                      CBS_ASN1_OCTETSTRING)) {
      OPENSSL_PUT_ERROR(PKCS8, PKCS8_R_BAD_PKCS12_DATA);
      goto err;
    }

    if (!CBS_mem_equal(&contents_type, kPKCS7Data, sizeof(kPKCS7Data))) {
      OPENSSL_PUT_ERROR(PKCS8, PKCS8_R_BAD_PKCS12_DATA);
      goto err;
    }

    if (!pkcs8_pbe_decrypt(&out, &out_len, &ai, ctx->password,
                           ctx->password_len, CBS_data(&encrypted_contents),
                           CBS_len(&encrypted_contents))) {
      goto err;
    }

    CBS safe_contents;
    CBS_init(&safe_contents, out, out_len);
    ret = PKCS12_handle_sequence(&safe_contents, ctx, PKCS12_handle_safe_bag);
    OPENSSL_free(out);
  } else if (CBS_mem_equal(&content_type, kPKCS7Data, sizeof(kPKCS7Data))) {
    CBS octet_string_contents;

    if (!CBS_get_asn1(&wrapped_contents, &octet_string_contents,
                      CBS_ASN1_OCTETSTRING)) {
      OPENSSL_PUT_ERROR(PKCS8, PKCS8_R_BAD_PKCS12_DATA);
      goto err;
    }

    ret = PKCS12_handle_sequence(&octet_string_contents, ctx,
                                 PKCS12_handle_safe_bag);
  } else {
    // Unknown element type - ignore it.
    ret = 1;
  }

err:
  OPENSSL_free(storage);
  return ret;
}